

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httplib.hpp
# Opt level: O2

socket_t __thiscall
httplib::Server::create_server_socket
          (Server *this,char *host,int port,int socket_flags,SocketOptions *socket_options)

{
  bool bVar1;
  _Manager_type p_Var2;
  socket_t sVar3;
  _Any_data local_28;
  _Manager_type local_18;
  _Invoker_type local_10;
  
  bVar1 = this->tcp_nodelay_;
  local_28._M_unused._M_object = (void *)0x0;
  local_28._8_8_ = 0;
  local_18 = (_Manager_type)0x0;
  local_10 = socket_options->_M_invoker;
  p_Var2 = (socket_options->super__Function_base)._M_manager;
  if (p_Var2 != (_Manager_type)0x0) {
    local_28._M_unused._0_8_ =
         (undefined8)*(undefined8 *)&(socket_options->super__Function_base)._M_functor;
    local_28._8_8_ = *(undefined8 *)((long)&(socket_options->super__Function_base)._M_functor + 8);
    (socket_options->super__Function_base)._M_manager = (_Manager_type)0x0;
    socket_options->_M_invoker = (_Invoker_type)0x0;
    local_18 = p_Var2;
  }
  sVar3 = detail::
          create_socket<httplib::Server::create_server_socket(char_const*,int,int,std::function<void(int)>)const::_lambda(int,addrinfo&)_1_>
                    (host,port,socket_flags,bVar1,&local_28);
  std::_Function_base::~_Function_base((_Function_base *)&local_28);
  return sVar3;
}

Assistant:

inline socket_t
        Server::create_server_socket(const char* host, int port, int socket_flags,
            SocketOptions socket_options) const {
        return detail::create_socket(
            host, port, socket_flags, tcp_nodelay_, std::move(socket_options),
            [](socket_t sock, struct addrinfo& ai) -> bool {
                if (::bind(sock, ai.ai_addr, static_cast<socklen_t>(ai.ai_addrlen))) {
                    return false;
                }
                if (::listen(sock, 5)) { // Listen through 5 channels
                    return false;
                }
                return true;
            });
    }